

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O3

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::NewWritableFile
          (PosixEnv *this,string *filename,WritableFile **result)

{
  int fd;
  PosixWritableFile *this_00;
  undefined8 *in_RCX;
  long in_FS_OFFSET;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  fd = open((char *)*result,0x80241,0x1a4);
  if (fd < 0) {
    *in_RCX = 0;
    __errno_location();
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      PosixError((string *)this,(int)*result);
      return (Status)(char *)this;
    }
  }
  else {
    this_00 = (PosixWritableFile *)operator_new(0x10058);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,*result,
               (long)&(*result)->_vptr_WritableFile + (long)&result[1]->_vptr_WritableFile);
    PosixWritableFile::PosixWritableFile(this_00,&local_58,fd);
    *in_RCX = this_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    (this->super_Env)._vptr_Env = (_func_int **)0x0;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (Status)(char *)this;
    }
  }
  __stack_chk_fail();
}

Assistant:

Status NewWritableFile(const std::string& filename,
                         WritableFile** result) override {
    int fd = ::open(filename.c_str(),
                    O_TRUNC | O_WRONLY | O_CREAT | kOpenBaseFlags, 0644);
    if (fd < 0) {
      *result = nullptr;
      return PosixError(filename, errno);
    }

    *result = new PosixWritableFile(filename, fd);
    return Status::OK();
  }